

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

int __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::clone
          (SimpleFilteredSentenceBreakIterator *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  SimpleFilteredSentenceBreakIterator *this_00;
  
  this_00 = (SimpleFilteredSentenceBreakIterator *)
            UMemory::operator_new((UMemory *)0x160,(size_t)__fn);
  if (this_00 != (SimpleFilteredSentenceBreakIterator *)0x0) {
    SimpleFilteredSentenceBreakIterator(this_00,this);
  }
  return (int)this_00;
}

Assistant:

virtual BreakIterator* clone(void) const { return new SimpleFilteredSentenceBreakIterator(*this); }